

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5PorterCb(void *pCtx,int tflags,char *pToken,int nToken,int iStart,int iEnd)

{
  int *piVar1;
  short *psVar2;
  char *pcVar3;
  byte bVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  code *UNRECOVERED_JUMPTABLE;
  ulong uVar10;
  byte *pbVar11;
  byte bVar12;
  ulong uVar13;
  char *zStem;
  int nBuf;
  uint uVar14;
  byte bVar15;
  undefined4 in_register_00000034;
  undefined8 uVar16;
  undefined4 in_register_00000084;
  uint uVar17;
  uint uVar18;
  
  uVar8 = CONCAT44(in_register_00000084,iStart);
  uVar13 = CONCAT44(in_register_00000034,tflags);
  if (nToken - 0x41U < 0xffffffc2) {
    uVar16 = *pCtx;
    UNRECOVERED_JUMPTABLE = *(code **)((long)pCtx + 8);
    uVar10 = (ulong)(uint)nToken;
    zStem = pToken;
    goto LAB_001b2206;
  }
  zStem = *(char **)((long)pCtx + 0x10);
  uVar13 = (ulong)(uint)nToken;
  memcpy(zStem,pToken,uVar13);
  uVar18 = nToken;
  if (zStem[nToken - 1U] == 's') {
    uVar14 = nToken - 2;
    if (zStem[uVar14] != 's') {
      if (zStem[uVar14] == 'e') {
        uVar18 = uVar14;
        if ((uint)nToken < 5) {
          uVar13 = 4;
          if (nToken != 4) goto LAB_001b1561;
        }
        else if ((zStem[uVar13 - 4] == 's') && (zStem[uVar13 - 3] == 's')) goto LAB_001b1563;
        if (zStem[uVar13 - 3] == 'i') goto LAB_001b1563;
      }
LAB_001b1561:
      uVar18 = nToken - 1U;
    }
  }
LAB_001b1563:
  uVar14 = uVar18 - 2;
  uVar13 = (ulong)uVar14;
  if (zStem[uVar13] == 'e') {
    if (uVar18 < 4) {
      uVar8 = 2;
      if (uVar18 == 3) goto LAB_001b1632;
      goto LAB_001b1642;
    }
    uVar17 = uVar18 - 3;
    if (zStem[(ulong)uVar17 + 2] == 'd' && *(short *)(zStem + uVar17) == 0x6565) {
      iVar7 = fts5PorterGobbleVC(zStem,uVar17,0);
      if (iVar7 != 0) {
        (zStem + uVar17)[0] = 'e';
        (zStem + uVar17)[1] = 'e';
        uVar18 = uVar18 - 1;
      }
    }
    else {
LAB_001b1632:
      if (*(short *)(zStem + uVar13) == 0x6465) {
        uVar8 = 0;
        do {
          bVar15 = zStem[uVar8] + 0x9f;
          bVar15 = bVar15 >> 1 | bVar15 * -0x80;
          if (((bVar15 < 0xb) && ((0x495U >> (bVar15 & 0x1f) & 1) != 0)) ||
             (zStem[uVar8] == 'y' && uVar8 != 0)) goto LAB_001b1a79;
          uVar8 = uVar8 + 1;
        } while (uVar13 != uVar8);
      }
    }
  }
  else if ((zStem[uVar13] == 'n') && (3 < uVar18)) {
    uVar14 = uVar18 - 3;
    uVar13 = (ulong)uVar14;
    if (zStem[uVar13 + 2] == 'g' && *(short *)(zStem + uVar13) == 0x6e69) {
      uVar8 = 0;
      do {
        bVar15 = zStem[uVar8] + 0x9f;
        bVar15 = bVar15 >> 1 | bVar15 * -0x80;
        if (((bVar15 < 0xb) && ((0x495U >> (bVar15 & 0x1f) & 1) != 0)) ||
           (zStem[uVar8] == 'y' && uVar8 != 0)) goto LAB_001b1a79;
        uVar8 = uVar8 + 1;
      } while (uVar13 != uVar8);
    }
  }
  uVar8 = (ulong)uVar18;
  goto LAB_001b1642;
LAB_001b1a79:
  pcVar3 = zStem + (int)uVar14;
  pbVar11 = (byte *)(pcVar3 + -2);
  bVar15 = *pbVar11;
  if (bVar15 == 0x69) {
    if (((int)uVar14 < 3) || (*(short *)pbVar11 != 0x7a69)) goto LAB_001b1b88;
    *pcVar3 = 'e';
    pbVar11[0] = 0x69;
    pbVar11[1] = 0x7a;
LAB_001b1d58:
    uVar14 = uVar14 + 1;
  }
  else {
    if (bVar15 == 0x62) {
      if (((int)uVar14 < 3) || (*(short *)pbVar11 != 0x6c62)) goto LAB_001b1b88;
      *pcVar3 = 'e';
      pbVar11[0] = 0x62;
      pbVar11[1] = 0x6c;
      goto LAB_001b1d58;
    }
    if (((bVar15 == 0x61) && (2 < (int)uVar14)) && (*(short *)pbVar11 == 0x7461)) {
      *pcVar3 = 'e';
      pbVar11[0] = 0x61;
      pbVar11[1] = 0x74;
      goto LAB_001b1d58;
    }
LAB_001b1b88:
    lVar9 = (long)(int)uVar14;
    bVar4 = (zStem + lVar9)[-1];
    bVar12 = (byte)(bVar4 + 0x9f) >> 1 | (bVar4 + 0x9f) * -0x80;
    if ((((bVar12 < 0xb) && ((0x495U >> (bVar12 & 0x1f) & 1) != 0)) ||
        ((bVar4 - 0x6c < 0xf && ((0x4081U >> (bVar4 - 0x6c & 0x1f) & 1) != 0)))) ||
       (bVar4 != bVar15)) {
      iVar7 = fts5Porter_MEq1(zStem,uVar14);
      if ((iVar7 != 0) && (iVar7 = fts5Porter_Ostar(zStem,uVar14), iVar7 != 0)) {
        uVar14 = uVar14 + 1;
        zStem[lVar9] = 'e';
      }
    }
    else {
      uVar14 = uVar14 - 1;
    }
  }
  uVar8 = (ulong)uVar14;
LAB_001b1642:
  uVar18 = (uint)uVar8;
  lVar9 = (long)(int)uVar18;
  if ((1 < (int)uVar18) && (zStem[lVar9 + -1] == 'y')) {
    uVar13 = 0;
    do {
      bVar15 = zStem[uVar13] + 0x9f;
      bVar15 = bVar15 >> 1 | bVar15 * -0x80;
      if (((bVar15 < 0xb) && ((0x495U >> (bVar15 & 0x1f) & 1) != 0)) ||
         (zStem[uVar13] == 'y' && uVar13 != 0)) {
        zStem[uVar8 - 1] = 'i';
        break;
      }
      uVar13 = uVar13 + 1;
    } while ((lVar9 - 1U & 0xffffffff) != uVar13);
  }
  uVar10 = uVar8;
  switch(zStem[lVar9 + -2]) {
  case 'a':
    if ((int)uVar18 < 8) {
      if (uVar18 == 7) goto LAB_001b1b1c;
    }
    else {
      uVar14 = uVar18 - 7;
      if (*(int *)(zStem + (ulong)uVar14 + 3) == 0x6c616e6f &&
          *(int *)(zStem + uVar14) == 0x6f697461) {
        iVar7 = fts5PorterGobbleVC(zStem,uVar14,0);
        if (iVar7 != 0) {
          pcVar3 = zStem + uVar14;
          pcVar3[2] = 'e';
          pcVar3[0] = 'a';
          pcVar3[1] = 't';
          goto LAB_001b1d79;
        }
      }
      else {
LAB_001b1b1c:
        uVar14 = uVar18 - 6;
        if ((*(short *)(zStem + (ulong)uVar14 + 4) == 0x6c61 &&
             *(int *)(zStem + uVar14) == 0x6e6f6974) &&
           (iVar7 = fts5PorterGobbleVC(zStem,uVar14,0), iVar7 != 0)) {
          builtin_strncpy(zStem + uVar14,"tion",4);
LAB_001b1d98:
          uVar8 = (ulong)(uVar18 - 2);
        }
      }
    }
    break;
  case 'c':
    if (4 < (int)uVar18) {
      uVar18 = uVar18 - 4;
      if (*(int *)(zStem + uVar18) == 0x69636e65) {
        iVar7 = fts5PorterGobbleVC(zStem,uVar18,0);
        if (iVar7 != 0) {
          builtin_strncpy(zStem + uVar18,"ence",4);
        }
      }
      else if ((*(int *)(zStem + uVar18) == 0x69636e61) &&
              (iVar7 = fts5PorterGobbleVC(zStem,uVar18,0), iVar7 != 0)) {
        builtin_strncpy(zStem + uVar18,"ance",4);
      }
    }
    break;
  case 'e':
    if ((int)uVar18 < 5) break;
    uVar18 = uVar18 - 4;
    if (*(int *)(zStem + uVar18) != 0x72657a69) break;
    iVar7 = fts5PorterGobbleVC(zStem,uVar18,0);
    if (iVar7 == 0) goto LAB_001b1d9f;
    pcVar3 = zStem + uVar18;
    pcVar3[2] = 'e';
    pcVar3[0] = 'i';
    pcVar3[1] = 'z';
LAB_001b1c1f:
    uVar10 = lVar9 - 1U & 0xffffffff;
    goto LAB_001b1d9f;
  case 'g':
    if (4 < (int)uVar18) {
      uVar18 = uVar18 - 4;
      if (*(int *)(zStem + uVar18) == 0x69676f6c) {
        iVar7 = fts5PorterGobbleVC(zStem,uVar18,0);
        if (iVar7 != 0) {
          pcVar3 = zStem + uVar18;
          pcVar3[2] = 'g';
          pcVar3[0] = 'l';
          pcVar3[1] = 'o';
          goto LAB_001b1c1f;
        }
        goto LAB_001b1d9f;
      }
    }
    break;
  case 'l':
    if (3 < (int)uVar18) {
      uVar14 = uVar18 - 3;
      psVar2 = (short *)(zStem + uVar14);
      if (zStem[(ulong)uVar14 + 2] == 'i' && *(short *)(zStem + uVar14) == 0x6c62) {
        iVar7 = fts5PorterGobbleVC(zStem,uVar14,0);
        if (iVar7 != 0) {
          *(undefined1 *)(psVar2 + 1) = 0x65;
          *psVar2 = 0x6c62;
        }
      }
      else if (uVar18 == 4) {
LAB_001b1c26:
        if ((char)psVar2[1] == 'i' && *psVar2 == 0x6c65) {
LAB_001b1c41:
          iVar7 = fts5PorterGobbleVC(zStem,uVar14,0);
          if (iVar7 != 0) {
            *(undefined1 *)psVar2 = 0x65;
            goto LAB_001b1d98;
          }
        }
      }
      else {
        uVar17 = uVar18 - 4;
        if (*(int *)(zStem + uVar17) != 0x696c6c61) {
          if (uVar18 < 6) goto LAB_001b1c26;
          uVar17 = uVar18 - 5;
          piVar1 = (int *)(zStem + uVar17);
          if (zStem[(ulong)uVar17 + 4] != 'i' || *(int *)(zStem + uVar17) != 0x6c746e65) {
            if ((char)psVar2[1] != 'i' || *psVar2 != 0x6c65) {
              if (((char)piVar1[1] == 'i' && *piVar1 == 0x6c73756f) &&
                 (iVar7 = fts5PorterGobbleVC(zStem,uVar17,0), iVar7 != 0)) {
                *(undefined1 *)((long)piVar1 + 2) = 0x73;
                *(undefined2 *)piVar1 = 0x756f;
                goto LAB_001b1d98;
              }
              break;
            }
            goto LAB_001b1c41;
          }
          iVar7 = fts5PorterGobbleVC(zStem,uVar17,0);
          if (iVar7 == 0) break;
          *(undefined1 *)((long)piVar1 + 2) = 0x74;
          *(undefined2 *)piVar1 = 0x6e65;
          goto LAB_001b1d98;
        }
        iVar7 = fts5PorterGobbleVC(zStem,uVar17,0);
        if (iVar7 != 0) {
          (zStem + uVar17)[0] = 'a';
          (zStem + uVar17)[1] = 'l';
          goto LAB_001b1d98;
        }
      }
    }
    break;
  case 'o':
    if ((int)uVar18 < 8) {
      if (5 < (int)uVar18) goto LAB_001b1ace;
      if (uVar18 != 5) break;
LAB_001b1be8:
      uVar18 = uVar18 - 4;
      if (*(int *)(zStem + uVar18) == 0x726f7461) {
        iVar7 = fts5PorterGobbleVC(zStem,uVar18,0);
        if (iVar7 != 0) {
          pcVar3 = zStem + uVar18;
          pcVar3[2] = 'e';
          pcVar3[0] = 'a';
          pcVar3[1] = 't';
          goto LAB_001b1c1f;
        }
        goto LAB_001b1d9f;
      }
    }
    else {
      uVar14 = uVar18 - 7;
      if (*(int *)(zStem + (ulong)uVar14 + 3) == 0x6e6f6974 &&
          *(int *)(zStem + uVar14) == 0x74617a69) {
        iVar7 = fts5PorterGobbleVC(zStem,uVar14,0);
        if (iVar7 != 0) {
          pcVar3 = zStem + uVar14;
          pcVar3[2] = 'e';
          pcVar3[0] = 'i';
          pcVar3[1] = 'z';
          goto LAB_001b1d79;
        }
      }
      else {
LAB_001b1ace:
        uVar14 = uVar18 - 5;
        if (zStem[(ulong)uVar14 + 4] != 'n' || *(int *)(zStem + uVar14) != 0x6f697461)
        goto LAB_001b1be8;
        iVar7 = fts5PorterGobbleVC(zStem,uVar14,0);
        if (iVar7 != 0) {
          pcVar3 = zStem + uVar14;
          pcVar3[2] = 'e';
          pcVar3[0] = 'a';
          pcVar3[1] = 't';
          goto LAB_001b1d98;
        }
      }
    }
    break;
  case 's':
    if (5 < (int)uVar18) {
      uVar14 = uVar18 - 5;
      if (zStem[(ulong)uVar14 + 4] == 'm' && *(int *)(zStem + uVar14) == 0x73696c61) {
        iVar7 = fts5PorterGobbleVC(zStem,uVar14,0);
        if (iVar7 != 0) {
          (zStem + uVar14)[0] = 'a';
          (zStem + uVar14)[1] = 'l';
          goto LAB_001b1cb2;
        }
      }
      else if (7 < uVar18) {
        uVar14 = uVar18 - 7;
        piVar1 = (int *)(zStem + uVar14);
        if (*(int *)(zStem + (ulong)uVar14 + 3) == 0x7373656e &&
            *(int *)(zStem + uVar14) == 0x6e657669) {
          iVar7 = fts5PorterGobbleVC(zStem,uVar14,0);
          if (iVar7 != 0) {
            *(undefined1 *)((long)piVar1 + 2) = 0x65;
            *(undefined2 *)piVar1 = 0x7669;
            goto LAB_001b1d79;
          }
        }
        else if (*(int *)((long)piVar1 + 3) == 0x7373656e && *piVar1 == 0x6e6c7566) {
          iVar7 = fts5PorterGobbleVC(zStem,uVar14,0);
          if (iVar7 != 0) {
            *(undefined1 *)((long)piVar1 + 2) = 0x6c;
            *(undefined2 *)piVar1 = 0x7566;
            goto LAB_001b1d79;
          }
        }
        else if ((*(int *)((long)piVar1 + 3) == 0x7373656e && *piVar1 == 0x6e73756f) &&
                (iVar7 = fts5PorterGobbleVC(zStem,uVar14,0), iVar7 != 0)) {
          *(undefined1 *)((long)piVar1 + 2) = 0x73;
          *(undefined2 *)piVar1 = 0x756f;
LAB_001b1d79:
          uVar8 = (ulong)(uVar18 - 4);
        }
      }
    }
    break;
  case 't':
    if (5 < (int)uVar18) {
      uVar14 = uVar18 - 5;
      piVar1 = (int *)(zStem + uVar14);
      if (zStem[(ulong)uVar14 + 4] == 'i' && *(int *)(zStem + uVar14) == 0x74696c61) {
        iVar7 = fts5PorterGobbleVC(zStem,uVar14,0);
        if (iVar7 != 0) {
          *(undefined2 *)piVar1 = 0x6c61;
LAB_001b1cb2:
          uVar8 = (ulong)(uVar18 - 3);
        }
      }
      else if ((char)piVar1[1] == 'i' && *piVar1 == 0x74697669) {
        iVar7 = fts5PorterGobbleVC(zStem,uVar14,0);
        if (iVar7 != 0) {
          *(undefined1 *)((long)piVar1 + 2) = 0x65;
          *(undefined2 *)piVar1 = 0x7669;
          goto LAB_001b1d98;
        }
      }
      else {
        uVar10 = 6;
        if (uVar18 == 6) goto LAB_001b1d9f;
        uVar14 = uVar18 - 6;
        if ((*(short *)(zStem + (ulong)uVar14 + 4) == 0x6974 &&
             *(int *)(zStem + uVar14) == 0x696c6962) &&
           (iVar7 = fts5PorterGobbleVC(zStem,uVar14,0), iVar7 != 0)) {
          pcVar3 = zStem + uVar14;
          pcVar3[2] = 'e';
          pcVar3[0] = 'b';
          pcVar3[1] = 'l';
          goto LAB_001b1cb2;
        }
      }
    }
  }
  uVar10 = uVar8;
LAB_001b1d9f:
  iVar7 = (int)uVar10;
  switch(zStem[(long)iVar7 + -2]) {
  case 's':
    if ((4 < iVar7) && (uVar13 = (ulong)(iVar7 - 4), *(int *)(zStem + uVar13) == 0x7373656e)) {
LAB_001b1f1a:
      iVar7 = fts5PorterGobbleVC(zStem,(int)uVar13,0);
      if (iVar7 != 0) {
LAB_001b1f2b:
        uVar10 = uVar13;
      }
    }
    break;
  case 't':
    if (5 < iVar7) {
      uVar18 = iVar7 - 5;
      if (((zStem[(ulong)uVar18 + 4] == 'e' && *(int *)(zStem + uVar18) == 0x74616369) ||
          (zStem[(ulong)uVar18 + 4] == 'i' && *(int *)(zStem + uVar18) == 0x74696369)) &&
         (iVar6 = fts5PorterGobbleVC(zStem,uVar18,0), iVar6 != 0)) {
        (zStem + uVar18)[0] = 'i';
        (zStem + uVar18)[1] = 'c';
LAB_001b1ef3:
        uVar18 = iVar7 - 3;
LAB_001b1ef6:
        uVar13 = (ulong)uVar18;
        goto LAB_001b1f2b;
      }
    }
    break;
  case 'u':
    if ((3 < iVar7) &&
       (uVar13 = (ulong)(iVar7 - 3),
       zStem[uVar13 + 2] == 'l' && *(short *)(zStem + uVar13) == 0x7566)) goto LAB_001b1f1a;
    break;
  case 'v':
    if ((5 < iVar7) &&
       (uVar13 = (ulong)(iVar7 - 5),
       zStem[uVar13 + 4] == 'e' && *(int *)(zStem + uVar13) == 0x76697461)) goto LAB_001b1f1a;
    break;
  case 'w':
  case 'x':
  case 'y':
    break;
  case 'z':
    if (5 < iVar7) {
      uVar18 = iVar7 - 5;
      if ((zStem[(ulong)uVar18 + 4] == 'e' && *(int *)(zStem + uVar18) == 0x7a696c61) &&
         (iVar6 = fts5PorterGobbleVC(zStem,uVar18,0), iVar6 != 0)) {
        (zStem + uVar18)[0] = 'a';
        (zStem + uVar18)[1] = 'l';
        goto LAB_001b1ef3;
      }
    }
    break;
  default:
    if ((zStem[(long)iVar7 + -2] == 'a') && (4 < iVar7)) {
      uVar18 = iVar7 - 4;
      if ((*(int *)(zStem + uVar18) == 0x6c616369) &&
         (iVar6 = fts5PorterGobbleVC(zStem,uVar18,0), iVar6 != 0)) {
        (zStem + uVar18)[0] = 'i';
        (zStem + uVar18)[1] = 'c';
        uVar18 = iVar7 - 2;
        goto LAB_001b1ef6;
      }
    }
  }
  uVar18 = (uint)uVar10;
  if ((byte)zStem[(long)(int)uVar18 + -2] - 0x61 < 0x1a) {
    uVar13 = (long)(int)uVar18 - 2;
    switch((uint)(byte)zStem[(long)(int)uVar18 + -2]) {
    case 0x61:
      if ((2 < (int)uVar18) && (*(short *)(zStem + uVar13) == 0x6c61)) {
LAB_001b2194:
        iVar7 = fts5Porter_MGt1(zStem,(int)uVar13);
        uVar8 = uVar13;
LAB_001b219f:
        if (iVar7 != 0) {
          uVar10 = uVar8 & 0xffffffff;
        }
      }
      break;
    case 99:
      if ((4 < (int)uVar18) &&
         ((uVar13 = (ulong)(uVar18 - 4), *(int *)(zStem + uVar13) == 0x65636e61 ||
          (*(int *)(zStem + uVar13) == 0x65636e65)))) goto LAB_001b2194;
      break;
    case 0x65:
      if ((2 < (int)uVar18) && (*(short *)(zStem + uVar13) == 0x7265)) goto LAB_001b2194;
      break;
    case 0x69:
      if ((2 < (int)uVar18) && (*(short *)(zStem + uVar13) == 0x6369)) goto LAB_001b2194;
      break;
    case 0x6c:
      if ((4 < (int)uVar18) &&
         ((uVar13 = (ulong)(uVar18 - 4), *(int *)(zStem + uVar13) == 0x656c6261 ||
          (*(int *)(zStem + uVar13) == 0x656c6269)))) goto LAB_001b2194;
      break;
    case 0x6e:
      if (3 < (int)uVar18) {
        uVar13 = (ulong)(uVar18 - 3);
        if (zStem[uVar13 + 2] == 't' && *(short *)(zStem + uVar13) == 0x6e61) goto LAB_001b2194;
        if (uVar18 < 6) {
          if (uVar18 != 4) goto LAB_001b216b;
        }
        else {
          uVar8 = (ulong)(uVar18 - 5);
          if (zStem[uVar8 + 4] == 't' && *(int *)(zStem + uVar8) == 0x6e656d65) goto LAB_001b2239;
LAB_001b216b:
          uVar8 = (ulong)(uVar18 - 4);
          if (*(int *)(zStem + uVar8) == 0x746e656d) goto LAB_001b2239;
        }
        uVar5 = *(ushort *)(zStem + uVar13) ^ 0x6e65;
        bVar15 = zStem[uVar13 + 2] ^ 0x74;
LAB_001b218f:
        if (bVar15 == 0 && uVar5 == 0) goto LAB_001b2194;
      }
      break;
    case 0x6f:
      if ((int)uVar18 < 4) {
        if (uVar18 == 3) goto LAB_001b215b;
      }
      else {
        uVar8 = (ulong)(uVar18 - 3);
        if (zStem[uVar8 + 2] == 'n' && *(short *)(zStem + uVar8) == 0x6f69) {
          if (1 < (byte)(zStem[uVar8 - 1] + 0x8dU)) break;
LAB_001b2239:
          iVar7 = fts5Porter_MGt1(zStem,(int)uVar8);
          goto LAB_001b219f;
        }
LAB_001b215b:
        if (*(short *)(zStem + uVar13) == 0x756f) goto LAB_001b2194;
      }
      break;
    case 0x73:
      if (3 < (int)uVar18) {
        uVar13 = (ulong)(uVar18 - 3);
        uVar5 = *(ushort *)(zStem + uVar13) ^ 0x7369;
        bVar15 = zStem[uVar13 + 2] ^ 0x6d;
        goto LAB_001b218f;
      }
      break;
    case 0x74:
      if (3 < (int)uVar18) {
        uVar13 = (ulong)(uVar18 - 3);
        if (zStem[uVar13 + 2] != 'e' || *(short *)(zStem + uVar13) != 0x7461) {
          uVar5 = *(ushort *)(zStem + uVar13) ^ 0x7469;
          bVar15 = zStem[uVar13 + 2] ^ 0x69;
          goto LAB_001b218f;
        }
        goto LAB_001b2194;
      }
      break;
    case 0x75:
      if (3 < (int)uVar18) {
        uVar13 = (ulong)(uVar18 - 3);
        uVar5 = *(ushort *)(zStem + uVar13) ^ 0x756f;
        bVar15 = zStem[uVar13 + 2] ^ 0x73;
        goto LAB_001b218f;
      }
      break;
    case 0x76:
      if (3 < (int)uVar18) {
        uVar13 = (ulong)(uVar18 - 3);
        uVar5 = *(ushort *)(zStem + uVar13) ^ 0x7669;
LAB_001b2014:
        bVar15 = zStem[uVar13 + 2] ^ 0x65;
        goto LAB_001b218f;
      }
      break;
    case 0x7a:
      if (3 < (int)uVar18) {
        uVar13 = (ulong)(uVar18 - 3);
        uVar5 = *(ushort *)(zStem + uVar13) ^ 0x7a69;
        goto LAB_001b2014;
      }
    }
  }
  if (zStem[(long)(int)uVar10 + -1] == 'e') {
    uVar13 = (long)(int)uVar10 - 1;
    iVar6 = (int)uVar13;
    iVar7 = fts5Porter_MGt1(zStem,iVar6);
    if ((iVar7 != 0) ||
       ((iVar7 = fts5Porter_MEq1(zStem,iVar6), iVar7 != 0 &&
        (iVar7 = fts5Porter_Ostar(zStem,iVar6), iVar7 == 0)))) {
      uVar10 = uVar13 & 0xffffffff;
    }
  }
  if ((((1 < (int)uVar10) && (uVar18 = (int)uVar10 - 1, zStem[uVar18] == 'l')) &&
      (zStem[uVar10 - 2] == 'l')) && (iVar7 = fts5Porter_MGt1(zStem,uVar18), iVar7 != 0)) {
    uVar10 = (ulong)uVar18;
  }
  uVar16 = *pCtx;
  UNRECOVERED_JUMPTABLE = *(code **)((long)pCtx + 8);
  uVar13 = (ulong)(uint)tflags;
  uVar8 = (ulong)(uint)iStart;
LAB_001b2206:
  iVar7 = (*UNRECOVERED_JUMPTABLE)(uVar16,uVar13,zStem,uVar10,uVar8,iEnd);
  return iVar7;
}

Assistant:

static int fts5PorterCb(
  void *pCtx, 
  int tflags,
  const char *pToken, 
  int nToken, 
  int iStart, 
  int iEnd
){
  PorterContext *p = (PorterContext*)pCtx;

  char *aBuf;
  int nBuf;

  if( nToken>FTS5_PORTER_MAX_TOKEN || nToken<3 ) goto pass_through;
  aBuf = p->aBuf;
  nBuf = nToken;
  memcpy(aBuf, pToken, nBuf);

  /* Step 1. */
  fts5PorterStep1A(aBuf, &nBuf);
  if( fts5PorterStep1B(aBuf, &nBuf) ){
    if( fts5PorterStep1B2(aBuf, &nBuf)==0 ){
      char c = aBuf[nBuf-1];
      if( fts5PorterIsVowel(c, 0)==0 
       && c!='l' && c!='s' && c!='z' && c==aBuf[nBuf-2] 
      ){
        nBuf--;
      }else if( fts5Porter_MEq1(aBuf, nBuf) && fts5Porter_Ostar(aBuf, nBuf) ){
        aBuf[nBuf++] = 'e';
      }
    }
  }

  /* Step 1C. */
  if( aBuf[nBuf-1]=='y' && fts5Porter_Vowel(aBuf, nBuf-1) ){
    aBuf[nBuf-1] = 'i';
  }

  /* Steps 2 through 4. */
  fts5PorterStep2(aBuf, &nBuf);
  fts5PorterStep3(aBuf, &nBuf);
  fts5PorterStep4(aBuf, &nBuf);

  /* Step 5a. */
  assert( nBuf>0 );
  if( aBuf[nBuf-1]=='e' ){
    if( fts5Porter_MGt1(aBuf, nBuf-1) 
     || (fts5Porter_MEq1(aBuf, nBuf-1) && !fts5Porter_Ostar(aBuf, nBuf-1))
    ){
      nBuf--;
    }
  }

  /* Step 5b. */
  if( nBuf>1 && aBuf[nBuf-1]=='l' 
   && aBuf[nBuf-2]=='l' && fts5Porter_MGt1(aBuf, nBuf-1) 
  ){
    nBuf--;
  }

  return p->xToken(p->pCtx, tflags, aBuf, nBuf, iStart, iEnd);

 pass_through:
  return p->xToken(p->pCtx, tflags, pToken, nToken, iStart, iEnd);
}